

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<long_double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  context *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  quadratic_cost_type<long_double> *c;
  local_context *ctx;
  quadratic_cost_type<long_double> *pqVar7;
  int push;
  int iVar8;
  long loop;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble theta;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar13;
  double dVar14;
  bit_array x;
  int local_1b0;
  longdouble local_18c;
  quadratic_cost_type<long_double> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  slv;
  
  pqVar7 = original_costs;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  this_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  c = (quadratic_cost_type<long_double> *)ctx;
  iVar8 = variables;
  normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
            (&norm_costs,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<long_double> *)ctx,(random_engine *)(ulong)(uint)variables,
             (int)pqVar7);
  lVar9 = (longdouble)(this_00->parameters).kappa_step;
  lVar10 = (longdouble)(this_00->parameters).kappa_max;
  theta = (longdouble)(this_00->parameters).theta;
  dVar1 = (this_00->parameters).delta;
  if (0.0 <= dVar1) {
    local_18c = (longdouble)dVar1;
    lVar11 = in_ST0;
  }
  else {
    lVar12 = in_ST5;
    compute_delta<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
              ((longdouble *)this->m_ctx,(itm *)&norm_costs,(context *)(ulong)(uint)variables,c,
               theta,iVar8);
    lVar11 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar12;
    local_18c = in_ST0;
  }
  dVar2 = (this_00->parameters).pushing_k_factor;
  dVar3 = (this_00->parameters).pushing_objective_amplifier;
  dVar1 = (this_00->parameters).w;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  ::solver_inequalities_01coeff
            (&slv,&ctx->rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(this_00->parameters).order,variables);
  do {
    bVar4 = false;
LAB_0039dda4:
    if (((stop_task->_M_base)._M_i & 1U) != 0) {
      compute_order::~compute_order(&compute);
      solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
      ::~solver_inequalities_01coeff(&slv);
      quadratic_cost_type<long_double>::~quadratic_cost_type(&norm_costs);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&x.super_bit_array_impl.m_data);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar13 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
             ::reinit(best_recorder,ctx,bVar4,(this_00->parameters).kappa_min,
                      (this_00->parameters).kappa_max,&x);
    compute_order::
    init<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
              (&compute,&slv,&x);
    iVar8 = 0x7fffffff;
    lVar12 = (longdouble)dVar13;
    for (loop = 0; (((stop_task->_M_base)._M_i & 1U) == 0 && (loop != (this_00->parameters).limit));
        loop = loop + 1) {
      iVar5 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        (&compute,&slv,&x,&ctx->rng,lVar12,local_18c,theta);
      if (iVar5 == 0) {
        dVar14 = quadratic_cost_type<long_double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx,&x,dVar14,loop);
        bVar4 = true;
        goto LAB_0039df4f;
      }
      if (iVar5 <= iVar8) {
        iVar8 = iVar5;
      }
      if ((long)dVar1 < loop) {
        powl();
        lVar12 = lVar12 + lVar9 * lVar11;
        lVar11 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      in_ST5 = in_ST4;
      if (lVar10 < lVar12) break;
    }
    if (iVar8 < 1) {
      bVar4 = false;
LAB_0039df4f:
      local_1b0 = 0;
      for (iVar8 = 0;
          (((stop_task->_M_base)._M_i & 1U) == 0 && (iVar8 < (this_00->parameters).pushes_limit));
          iVar8 = iVar8 + 1) {
        iVar5 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                          (&compute,&slv,&x,&ctx->rng,(longdouble)dVar2,local_18c,theta,
                           (longdouble)dVar3);
        if (iVar5 == 0) {
          dVar14 = quadratic_cost_type<long_double>::results(original_costs,&x,cost_constant);
          best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,ctx,&x,dVar14,
                       (long)~((this_00->parameters).pushing_iteration_limit * iVar8));
          bVar4 = true;
        }
        iVar5 = 1;
        lVar12 = (longdouble)dVar13;
        while( true ) {
          if ((((stop_task->_M_base)._M_i & 1U) != 0) ||
             ((this_00->parameters).pushing_iteration_limit <= iVar5 + -1)) goto LAB_0039e12f;
          iVar6 = compute_order::
                  run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                            (&compute,&slv,&x,&ctx->rng,lVar12,local_18c,theta);
          if (iVar6 == 0) break;
          if ((this_00->parameters).w < (double)(iVar5 + -1)) {
            powl();
            lVar12 = lVar12 + lVar9 * lVar11;
            lVar11 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
          }
          in_ST5 = in_ST4;
          if (lVar10 < lVar12) goto LAB_0039e12f;
          iVar5 = iVar5 + 1;
        }
        dVar14 = quadratic_cost_type<long_double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx,&x,dVar14,
                     (long)((this_00->parameters).pushing_iteration_limit * local_1b0 - iVar5));
        bVar4 = true;
LAB_0039e12f:
        local_1b0 = local_1b0 + -1;
      }
      goto LAB_0039dda4;
    }
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
    ::try_advance(best_recorder,ctx,&x,iVar8,(this_00->parameters).limit);
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }